

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_service_client(t_haxe_generator *this,t_service *tservice)

{
  string *psVar1;
  ofstream_with_content_based_conditional_update *out;
  int *piVar2;
  t_struct *ptVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  char *pcVar6;
  pointer pptVar7;
  pointer pptVar8;
  string funname;
  string appex;
  string argsname;
  string retval;
  string result;
  string args;
  string resultname;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_client;
  string extends;
  string msg;
  string calltype;
  string local_330;
  allocator local_309;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_248;
  allocator local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  allocator local_1d0 [32];
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_210,"",local_230);
  std::__cxx11::string::string((string *)local_230,"",(allocator *)&local_330);
  if (tservice->extends_ != (t_service *)0x0) {
    iVar4 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string((string *)&local_150,(string *)CONCAT44(extraout_var,iVar4));
    get_cap_name(&local_330,this,&local_150);
    std::__cxx11::string::operator=((string *)&local_210,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_150);
    std::operator+(&local_2e8," extends ",&local_210);
    std::operator+(&local_330,&local_2e8,"Impl");
    std::__cxx11::string::operator=((string *)local_230,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  out = &this->f_service_;
  generate_rtti_decoration(this,(ostream *)out);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
  poVar5 = std::operator<<(poVar5,"class ");
  psVar1 = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::__cxx11::string::string((string *)&local_170,(string *)psVar1);
  get_cap_name(&local_330,this,&local_170);
  poVar5 = std::operator<<(poVar5,(string *)&local_330);
  poVar5 = std::operator<<(poVar5,"Impl");
  poVar5 = std::operator<<(poVar5,(string *)local_230);
  poVar5 = std::operator<<(poVar5," implements ");
  std::__cxx11::string::string((string *)&local_190,(string *)psVar1);
  get_cap_name(&local_2e8,this,&local_190);
  poVar5 = std::operator<<(poVar5,(string *)&local_2e8);
  poVar5 = std::operator<<(poVar5," {");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_170);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
  poVar5 = std::operator<<(poVar5,
                           "public function new( iprot : TProtocol, oprot : TProtocol = null)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)out);
  if (local_210._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"iprot_ = iprot;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"if (oprot == null) {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"oprot_ = iprot;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"} else {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"oprot_ = oprot;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"super(iprot, oprot);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_330);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  if (local_210._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"private var iprot_ : TProtocol;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_2e8);
    poVar5 = std::operator<<(poVar5,"private var oprot_ : TProtocol;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_288);
    poVar5 = std::operator<<(poVar5,"private var seqid_ : Int;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_330);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
    poVar5 = std::operator<<(poVar5,"public function getInputProtocol() : TProtocol");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)out);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
    poVar5 = std::operator<<(poVar5,"return this.iprot_;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
    poVar5 = std::operator<<(poVar5,"public function getOutputProtocol() : TProtocol");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)out);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
    poVar5 = std::operator<<(poVar5,"return this.oprot_;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_248,&tservice->functions_
            );
  for (pptVar8 = local_248._M_impl.super__Vector_impl_data._M_start;
      pptVar8 != local_248._M_impl.super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    std::__cxx11::string::string((string *)&local_330,(string *)&(*pptVar8)->name_);
    generate_service_method_signature_combined(this,*pptVar8,false);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
    ptVar3 = (*pptVar8)->arglist_;
    std::operator+(&local_50,&(*pptVar8)->name_,"_args");
    get_cap_name(&local_2e8,this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,"args",local_1d0);
    t_generator::tmp(&local_288,(t_generator *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pcVar6 = "CALL";
    if ((*pptVar8)->oneway_ != false) {
      pcVar6 = "ONEWAY";
    }
    std::__cxx11::string::string((string *)local_1d0,pcVar6,(allocator *)&local_2c8);
    t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_2c8);
    poVar5 = std::operator<<(poVar5,"oprot_.writeMessageBegin(new TMessage(\"");
    poVar5 = std::operator<<(poVar5,(string *)&local_330);
    poVar5 = std::operator<<(poVar5,"\", TMessageType.");
    poVar5 = std::operator<<(poVar5,(string *)local_1d0);
    poVar5 = std::operator<<(poVar5,", seqid_));");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_308);
    poVar5 = std::operator<<(poVar5,"var ");
    poVar5 = std::operator<<(poVar5,(string *)&local_288);
    poVar5 = std::operator<<(poVar5," : ");
    poVar5 = std::operator<<(poVar5,(string *)&local_2e8);
    poVar5 = std::operator<<(poVar5," = new ");
    poVar5 = std::operator<<(poVar5,(string *)&local_2e8);
    poVar5 = std::operator<<(poVar5,"();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2c8);
    for (pptVar7 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)out,(string *)&local_2c8);
      poVar5 = std::operator<<(poVar5,(string *)&local_288);
      poVar5 = std::operator<<(poVar5,".");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2c8);
    }
    t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)out,(string *)&local_2c8);
    poVar5 = std::operator<<(poVar5,(string *)&local_288);
    poVar5 = std::operator<<(poVar5,".write(oprot_);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_308);
    poVar5 = std::operator<<(poVar5,"oprot_.writeMessageEnd();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::string((string *)&local_90,"retval",(allocator *)&local_308);
    t_generator::tmp(&local_2c8,(t_generator *)this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if ((*pptVar8)->oneway_ == false) {
      iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar4 == '\0') {
        t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)out,(string *)&local_308);
        poVar5 = std::operator<<(poVar5,"var ");
        poVar5 = std::operator<<(poVar5,(string *)&local_2c8);
        poVar5 = std::operator<<(poVar5," : ");
        type_name_abi_cxx11_(&local_268,this,(*pptVar8)->returntype_,false,false);
        poVar5 = std::operator<<(poVar5,(string *)&local_268);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_308);
      }
    }
    if ((*pptVar8)->oneway_ == true) {
      t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)out,(string *)&local_308);
      poVar5 = std::operator<<(poVar5,"oprot_.getTransport().flush();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"oprot_.getTransport().flush(function(error:Dynamic) : Void {"
                              );
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"try {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      std::__cxx11::string::string((string *)&local_b0,"appex",(allocator *)&local_268);
      t_generator::tmp(&local_308,(t_generator *)this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"var ");
      poVar5 = std::operator<<(poVar5,(string *)&local_308);
      poVar5 = std::operator<<(poVar5," : TApplicationException;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator+(&local_d0,&(*pptVar8)->name_,"_result");
      get_cap_name(&local_268,this,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"if (error != null) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"if (onError == null)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"throw error;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"onError(error);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"return;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_f0,"msg",(allocator *)&local_2a8);
      t_generator::tmp(&local_1f0,(t_generator *)this,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"var ");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5," : TMessage = iprot_.readMessageBegin();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"if (");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,".type == TMessageType.EXCEPTION) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,(string *)&local_308);
      poVar5 = std::operator<<(poVar5," = TApplicationException.read(iprot_);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"iprot_.readMessageEnd();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"if (onError == null)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"throw ");
      poVar5 = std::operator<<(poVar5,(string *)&local_308);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"onError(");
      poVar5 = std::operator<<(poVar5,(string *)&local_308);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"return;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_110,"result",(allocator *)&local_1b0);
      t_generator::tmp(&local_2a8,(t_generator *)this,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"var ");
      poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
      poVar5 = std::operator<<(poVar5," : ");
      poVar5 = std::operator<<(poVar5,(string *)&local_268);
      poVar5 = std::operator<<(poVar5," = new ");
      poVar5 = std::operator<<(poVar5,(string *)&local_268);
      poVar5 = std::operator<<(poVar5,"();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"");
      poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
      poVar5 = std::operator<<(poVar5,".read(iprot_);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"iprot_.readMessageEnd();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar4 == '\0') {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"if (");
        poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
        poVar5 = std::operator<<(poVar5,".");
        std::__cxx11::string::string((string *)&local_130,"success",&local_309);
        generate_isset_check(&local_1b0,this,&local_130);
        poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
        poVar5 = std::operator<<(poVar5,") {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_130);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"if (onSuccess != null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"onSuccess(");
        poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
        poVar5 = std::operator<<(poVar5,".success);");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,(string *)&local_2c8);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
        poVar5 = std::operator<<(poVar5,".success;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"return;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"}");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      ptVar3 = (*pptVar8)->xceptions_;
      for (pptVar7 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar7 !=
          (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"if (");
        poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
        poVar5 = std::operator<<(poVar5,".");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
        poVar5 = std::operator<<(poVar5," != null) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"if (onError == null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"throw ");
        poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
        poVar5 = std::operator<<(poVar5,".");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"onError(");
        poVar5 = std::operator<<(poVar5,(string *)&local_2a8);
        poVar5 = std::operator<<(poVar5,".");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
        poVar5 = std::operator<<(poVar5,");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"return;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"}");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar4 == '\0') {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,(string *)&local_308);
        poVar5 = std::operator<<(poVar5," = new TApplicationException(");
        poVar5 = std::operator<<(poVar5,"TApplicationException.MISSING_RESULT,");
        poVar5 = std::operator<<(poVar5,"\"");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
        poVar5 = std::operator<<(poVar5," failed: unknown result\");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"if (onError == null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"throw ");
        poVar5 = std::operator<<(poVar5,(string *)&local_308);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"onError(");
        poVar5 = std::operator<<(poVar5,(string *)&local_308);
        poVar5 = std::operator<<(poVar5,");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"if (onSuccess != null)");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
        poVar5 = std::operator<<(poVar5,"onSuccess();");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
      }
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"return;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"} catch( e : TException) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"if (onError == null)");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"throw e;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"onError(e);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"return;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
      poVar5 = std::operator<<(poVar5,"});");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_268);
    }
    std::__cxx11::string::~string((string *)&local_308);
    if ((*pptVar8)->oneway_ == false) {
      iVar4 = (*((*pptVar8)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar4 == '\0') {
        t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)out,(string *)&local_308);
        poVar5 = std::operator<<(poVar5,"return ");
        poVar5 = std::operator<<(poVar5,(string *)&local_2c8);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_308);
      }
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_330);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)out);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_248);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)&local_210);
  return;
}

Assistant:

void t_haxe_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_cap_name(tservice->get_extends()->get_name());
    extends_client = " extends " + extends + "Impl";
  }

  generate_rtti_decoration(f_service_);
  // build macro is inherited from interface
  indent(f_service_) << "class " << get_cap_name(service_name_) << "Impl" << extends_client
                     << " implements " << get_cap_name(service_name_) << " {" << endl << endl;
  indent_up();

  indent(f_service_) << "public function new( iprot : TProtocol, oprot : TProtocol = null)" << endl;
  scope_up(f_service_);
  if (extends.empty()) {
    f_service_ << indent() << "iprot_ = iprot;" << endl;
    f_service_ << indent() << "if (oprot == null) {" << endl;
    indent_up();
    f_service_ << indent() << "oprot_ = iprot;" << endl;
    indent_down();
    f_service_ << indent() << "} else {" << endl;
    indent_up();
    f_service_ << indent() << "oprot_ = oprot;" << endl;
    indent_down();
    f_service_ << indent() << "}" << endl;
  } else {
    f_service_ << indent() << "super(iprot, oprot);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  if (extends.empty()) {
    f_service_ << indent() << "private var iprot_ : TProtocol;" << endl << indent()
               << "private var oprot_ : TProtocol;" << endl << indent()
               << "private var seqid_ : Int;" << endl << endl;

    indent(f_service_) << "public function getInputProtocol() : TProtocol" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.iprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;

    indent(f_service_) << "public function getOutputProtocol() : TProtocol" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.oprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();

    // Open function
    generate_service_method_signature(*f_iter, false, true);

    indent_up();

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    string argsname = get_cap_name((*f_iter)->get_name() + "_args");
    vector<t_field*>::const_iterator fld_iter;
    const vector<t_field*>& fields = arg_struct->get_members();

    // Serialize the request
    string args = tmp("args");
    string calltype = (*f_iter)->is_oneway() ? "ONEWAY" : "CALL";
    f_service_ << indent() << "oprot_.writeMessageBegin(new TMessage(\"" << funname
               << "\", TMessageType." << calltype << ", seqid_));" << endl << indent()
               << "var " << args << " : " << argsname << " = new " << argsname << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << args << "." << (*fld_iter)->get_name() << " = "
                 << (*fld_iter)->get_name() << ";" << endl;
    }

    f_service_ << indent() << args << ".write(oprot_);" << endl << indent()
               << "oprot_.writeMessageEnd();" << endl;

    string retval = tmp("retval");
    if (!((*f_iter)->is_oneway() || (*f_iter)->get_returntype()->is_void())) {
      f_service_ << indent() << "var " << retval << " : " << type_name((*f_iter)->get_returntype()) << ";"
                 << endl;
    }

    if ((*f_iter)->is_oneway()) {
      f_service_ << indent() << "oprot_.getTransport().flush();" << endl;
    } else {
      indent(f_service_) << "oprot_.getTransport().flush(function(error:Dynamic) : Void {" << endl;
      indent_up();
      indent(f_service_) << "try {" << endl;
      indent_up();
      string appex = tmp("appex");
      indent(f_service_) << "var " << appex << " : TApplicationException;" << endl;
      string resultname = get_cap_name((*f_iter)->get_name() + "_result");
      indent(f_service_) << "if (error != null) {" << endl;
      indent_up();
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw error;" << endl;
      indent_down();
      indent(f_service_) << "onError(error);" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl << endl;
      string msg = tmp("msg");
      indent(f_service_) << "var " << msg << " : TMessage = iprot_.readMessageBegin();" << endl;
      indent(f_service_) << "if (" << msg << ".type == TMessageType.EXCEPTION) {" << endl;
      indent_up();
      indent(f_service_) << appex << " = TApplicationException.read(iprot_);" << endl;
      indent(f_service_) << "iprot_.readMessageEnd();" << endl;
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw " << appex << ";" << endl;
      indent_down();
      indent(f_service_) << "onError(" << appex << ");" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl << endl;
      string result = tmp("result");
      indent(f_service_) << "var " << result << " : " << resultname << " = new " << resultname << "();" << endl;
      indent(f_service_) << "" << result << ".read(iprot_);" << endl;
      indent(f_service_) << "iprot_.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (" << result << "." << generate_isset_check("success") << ") {" << endl;
        indent_up();
        indent(f_service_) << "if (onSuccess != null)" << endl;
        indent_up();
        indent(f_service_) << "onSuccess(" << result << ".success);" << endl;
        indent_down();
        indent(f_service_) << retval << " = " << result << ".success;" << endl;
        indent(f_service_) << "return;" << endl;
        indent_down();
        indent(f_service_) << "}" << endl << endl;
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        indent(f_service_) << "if (" << result << "." << (*x_iter)->get_name() << " != null) {" << endl;
        indent_up();
        indent(f_service_) << "if (onError == null)" << endl;
        indent_up();
        indent(f_service_) << "throw " << result << "." << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        indent(f_service_) << "onError(" << result << "." << (*x_iter)->get_name() << ");" << endl;
        indent(f_service_) << "return;" << endl;
        indent_down();
        indent(f_service_) << "}" << endl << endl;
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (onSuccess != null)" << endl;
        indent_up();
        indent(f_service_) << "onSuccess();" << endl;
        indent_down();
        indent(f_service_) << "return;" << endl;
      } else {
        indent(f_service_) << appex << " = new TApplicationException("
                           << "TApplicationException.MISSING_RESULT,"
                           << "\"" << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
        indent(f_service_) << "if (onError == null)" << endl;
        indent_up();
        indent(f_service_) << "throw " << appex << ";" << endl;
        indent_down();
        indent(f_service_) << "onError(" << appex << ");" << endl;
        indent(f_service_) << "return;" << endl;
      }

      indent_down();
      indent(f_service_) << endl;
      indent(f_service_) << "} catch( e : TException) {" << endl;
      indent_up();
      indent(f_service_) << "if (onError == null)" << endl;
      indent_up();
      indent(f_service_) << "throw e;" << endl;
      indent_down();
      indent(f_service_) << "onError(e);" << endl;
      indent(f_service_) << "return;" << endl;
      indent_down();
      indent(f_service_) << "}" << endl;

      indent_down();
      indent(f_service_) << "});" << endl << endl;
    }

    if (!((*f_iter)->is_oneway() || (*f_iter)->get_returntype()->is_void())) {
      f_service_ << indent() << "return " << retval << ";" << endl;
    }

    // Close function
    scope_down(f_service_);
    f_service_ << endl;
  }

  indent_down();
  indent(f_service_) << "}" << endl;
}